

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall
QWizardField::QWizardField
          (QWizardField *this,QWizardPage *page,QString *spec,QObject *object,char *property,
          char *changedSignal)

{
  QString *this_00;
  char cVar1;
  
  this->page = page;
  this_00 = &this->name;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&this_00->d,&spec->d);
  this->mandatory = false;
  this->object = object;
  QByteArray::QByteArray(&this->property,property,-1);
  QByteArray::QByteArray(&this->changedSignal,changedSignal,-1);
  (this->initialValue).d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(this->initialValue).d.data + 8) = 0;
  *(undefined8 *)((long)&(this->initialValue).d.data + 0x10) = 0;
  *(undefined8 *)&(this->initialValue).d.field_0x18 = 2;
  cVar1 = QString::endsWith((QChar)(char16_t)this_00,0x2a);
  if (cVar1 != '\0') {
    QString::chop((longlong)this_00);
    this->mandatory = true;
  }
  return;
}

Assistant:

QWizardField::QWizardField(QWizardPage *page, const QString &spec, QObject *object,
                           const char *property, const char *changedSignal)
    : page(page), name(spec), mandatory(false), object(object), property(property),
      changedSignal(changedSignal)
{
    if (name.endsWith(u'*')) {
        name.chop(1);
        mandatory = true;
    }
}